

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

void match_list_free(match_list *list)

{
  match *pmVar1;
  match *q;
  match *p;
  match_list *list_local;
  
  q = list->first;
  while (q != (match *)0x0) {
    pmVar1 = q->next;
    archive_mstring_clean(&q->pattern);
    free(q);
    q = pmVar1;
  }
  return;
}

Assistant:

static void
match_list_free(struct match_list *list)
{
	struct match *p, *q;

	for (p = list->first; p != NULL; ) {
		q = p;
		p = p->next;
		archive_mstring_clean(&(q->pattern));
		free(q);
	}
}